

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  Fad<double> *pFVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  Fad<double> *pFVar6;
  Fad<double> *pFVar7;
  double dVar8;
  double dVar9;
  
  pFVar2 = (this->left_->fadexpr_).left_;
  pFVar3 = (this->left_->fadexpr_).right_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  pFVar5 = (pFVar4->fadexpr_).right_;
  pFVar6 = (pFVar3->fadexpr_).right_;
  dVar8 = ((double)(pFVar4->fadexpr_).left_.constant_ - pFVar5->val_) + pFVar6->val_;
  dVar1 = pFVar2->val_;
  pFVar7 = (this->right_->fadexpr_).right_;
  dVar9 = (double)(this->right_->fadexpr_).left_.constant_ + pFVar7->val_;
  return (((pFVar2->dx_).ptr_to_data[i] * dVar8 +
          ((pFVar6->dx_).ptr_to_data[i] - (pFVar5->dx_).ptr_to_data[i]) * dVar1) * dVar9 -
         dVar8 * dVar1 * (pFVar7->dx_).ptr_to_data[i]) / (dVar9 * dVar9);
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}